

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O1

int64_t __thiscall
SharedMemRingBuffer::ClaimIndex
          (SharedMemRingBuffer *this,size_t want_len,size_t *out_position_to_write)

{
  ulong uVar1;
  atomic<long> *paVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  ENUM_DATA_STATUS EVar10;
  
  if (this->max_data_size_ < want_len) {
    return -1;
  }
  LOCK();
  paVar2 = &this->ring_buffer_status_on_shared_mem_->next;
  uVar3 = (paVar2->super___atomic_base<long>)._M_i;
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  uVar1 = uVar3 + 1;
  (this->ring_buffer_).buffer_.
  super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
  super__Vector_impl_data._M_start[(this->ring_buffer_).capacity_ - 1 & uVar1]->status = DATA_EMPTY;
  sVar4 = this->buffer_size_;
  EVar10 = DATA_EMPTY;
  do {
    if (-1 < (long)uVar3) {
      EVar10 = (this->ring_buffer_).buffer_.
               super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
               super__Vector_impl_data._M_start
               [(this->ring_buffer_).capacity_ + 0x7fffffffffffffff & uVar3]->status;
    }
    if ((this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
        super___atomic_base<int>._M_i < 1) {
      lVar6 = 0;
    }
    else {
      lVar7 = 0;
      bVar9 = false;
      lVar6 = 0x7fffffffffffffff;
      do {
        lVar5 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[lVar7].
                super___atomic_base<long>._M_i;
        if (lVar5 < lVar6) {
          bVar9 = true;
          lVar6 = lVar5;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
                       super___atomic_base<int>._M_i);
      if (!bVar9) {
        lVar6 = 0;
      }
    }
    if (((long)(uVar1 - sVar4) < lVar6) && ((long)uVar3 < 0 || EVar10 != DATA_EMPTY)) {
      if (uVar1 == 0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (this->ring_buffer_).buffer_.
                super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
                super__Vector_impl_data._M_start[(this->ring_buffer_).capacity_ - 1 & uVar3]->
                offset_position;
      }
      *out_position_to_write = sVar8;
      if ((long)uVar3 < 0) {
        return uVar1;
      }
      if ((this->ring_buffer_).buffer_.
          super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->ring_buffer_).capacity_ + 0x7fffffffffffffff & uVar3]->offset_position + want_len
          <= this->raw_mem_buffer_capacity_) {
        return uVar1;
      }
      if ((lVar6 == 0) ||
         ((this->ring_buffer_status_on_shared_mem_->prev_reset_pos).super___atomic_base<long>._M_i
          <= lVar6)) {
        LOCK();
        (this->ring_buffer_status_on_shared_mem_->prev_reset_pos).super___atomic_base<long>._M_i =
             uVar1;
        UNLOCK();
        *out_position_to_write = 0;
        return uVar1;
      }
    }
    sched_yield();
  } while( true );
}

Assistant:

int64_t SharedMemRingBuffer::ClaimIndex(size_t want_len, size_t * out_position_to_write )
{
    if( want_len > max_data_size_ ) {
        DEBUG_ELOG("Error: Invalid data length : exceeds MAX : " << max_data_size_); 
        return -1;
    }
    ENUM_DATA_STATUS data_status = DATA_EMPTY;
    int64_t next_seq_for_claim = GetNextSequenceForClaim() ;
    ring_buffer_[next_seq_for_claim]->status =DATA_EMPTY; //init
    //다음 쓰기 위치 - 링버퍼 크기 = 링버퍼 한번 순회 이전위치, 
    //데이터 쓰기 작업이 링버퍼를 완전히 한바퀴 순회한 경우
    //여기서 더 진행하면 데이터를 이전 덮어쓰게 된다.
    //만약 아직 데이터를 read하지 못한 상태
    //(min customer index가 wrap position보다 작거나 같은 경우)라면 쓰기 작업은 대기해야 한다
    int64_t wrap_point = next_seq_for_claim - buffer_size_;

    do {
        if(next_seq_for_claim>0) {
            data_status = ring_buffer_[next_seq_for_claim-1]->status ;
        }

        int64_t gating_seq = GetMinIndexOfConsumers();
        if  ( wrap_point >=  gating_seq ) {
            std::this_thread::yield();
            continue;
        } else if  ( next_seq_for_claim>0 && data_status == DATA_EMPTY ) {
            //because of arbitrary data length, we need to wait until previous data is set 

            std::this_thread::yield();
            DEBUG_LOG("continue , DATA_EMPTY / next_seq_for_claim:" << next_seq_for_claim); 
            continue;
        } else {
            //calculate out_position_to_write
            if(next_seq_for_claim==0) {
                *out_position_to_write = 0;
            } else {
                *out_position_to_write = ring_buffer_[next_seq_for_claim-1]->offset_position ;
                DEBUG_LOG("write pos: "<< *out_position_to_write); 
            }

            if( next_seq_for_claim>0 && 
                ring_buffer_[next_seq_for_claim-1]->offset_position + want_len > raw_mem_buffer_capacity_ ) {
                //last write position + wanted data length > total data buffer size 
                //--> start from 0 position  
                DEBUG_LOG( "prev_reset_pos : "<< ring_buffer_status_on_shared_mem_->prev_reset_pos); 
                if( gating_seq!=0 && 
                    gating_seq < ring_buffer_status_on_shared_mem_->prev_reset_pos ) {
                    //but don't over-write customer data 
                    //'gating_seq == 0' means a consumer read index 0, so it is OK to write at index 0
                    
                    std::this_thread::yield();
                    DEBUG_LOG( "spin... / gating_seq=" << gating_seq
                          << " / next_seq_for_claim= "<< next_seq_for_claim 
                          << " / ring_buffer_status_on_shared_mem_->prev_reset_pos=" 
                          << ring_buffer_status_on_shared_mem_->prev_reset_pos ); 
                    continue;
                }
                ring_buffer_status_on_shared_mem_->prev_reset_pos = next_seq_for_claim ;
                DEBUG_LOG("raw_mem_buffer_capacity_ :"<< raw_mem_buffer_capacity_ 
                          << " / gating_seq: "<< gating_seq << " / want_len:"
                          << want_len <<" / ring_buffer_[gating_seq]->start_position: "
                          << ring_buffer_[gating_seq]->start_position );
                DEBUG_LOG( "reset pos 0 "); 
                *out_position_to_write = 0;
            }
            break;
        }
    } while (true);

    DEBUG_LOG("RETURN next_seq_for_claim:" << next_seq_for_claim ); 
    return next_seq_for_claim;
}